

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<QPointer<QObject>_>::reallocateAndGrow
          (QArrayDataPointer<QPointer<QObject>_> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QPointer<QObject>_> *old)

{
  Data *pDVar1;
  Data *pDVar2;
  undefined1 *puVar3;
  QObject *pQVar4;
  QPointer<QObject> *data;
  long lVar5;
  QPointer<QObject> *pQVar6;
  QPointer<QObject> *pQVar7;
  long in_FS_OFFSET;
  QArrayDataPointer<QPointer<QObject>_> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((old == (QArrayDataPointer<QPointer<QObject>_> *)0x0 && where == GrowsAtEnd) &&
       (pDVar1 = this->d, pDVar1 != (Data *)0x0)) && (0 < n)) &&
     ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      QtPrivate::QMovableArrayOps<QPointer<QObject>_>::reallocate
                ((QMovableArrayOps<QPointer<QObject>_> *)this,
                 n + this->size +
                 ((long)((long)this->ptr -
                        ((ulong)((long)&pDVar1[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
                        ) >> 4),Grow);
      return;
    }
  }
  else {
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = (QPointer<QObject> *)&DAT_aaaaaaaaaaaaaaaa;
    allocateGrow(&local_48,this,n,where);
    if (local_48.ptr == (QPointer<QObject> *)0x0 && 0 < n) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        qBadAlloc();
      }
    }
    else {
      if (this->size != 0) {
        lVar5 = this->size + (n >> 0x3f & n);
        if (((this->d == (Data *)0x0) || (old != (QArrayDataPointer<QPointer<QObject>_> *)0x0)) ||
           (1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
          if (0 < lVar5) {
            pQVar7 = this->ptr;
            pQVar6 = pQVar7 + lVar5;
            do {
              pDVar2 = (pQVar7->wp).d;
              local_48.ptr[local_48.size].wp.d = pDVar2;
              local_48.ptr[local_48.size].wp.value = (pQVar7->wp).value;
              if (pDVar2 != (Data *)0x0) {
                LOCK();
                (pDVar2->weakref)._q_value.super___atomic_base<int>._M_i =
                     (pDVar2->weakref)._q_value.super___atomic_base<int>._M_i + 1;
                UNLOCK();
              }
              pQVar7 = pQVar7 + 1;
              local_48.size = local_48.size + 1;
            } while (pQVar7 < pQVar6);
          }
        }
        else if (0 < lVar5) {
          pQVar7 = this->ptr;
          pQVar6 = pQVar7 + lVar5;
          do {
            pQVar4 = (pQVar7->wp).value;
            local_48.ptr[local_48.size].wp.d = (pQVar7->wp).d;
            local_48.ptr[local_48.size].wp.value = pQVar4;
            (pQVar7->wp).d = (Data *)0x0;
            (pQVar7->wp).value = (QObject *)0x0;
            pQVar7 = pQVar7 + 1;
            local_48.size = local_48.size + 1;
          } while (pQVar7 < pQVar6);
        }
      }
      pDVar1 = this->d;
      pQVar7 = this->ptr;
      this->d = local_48.d;
      this->ptr = local_48.ptr;
      puVar3 = (undefined1 *)this->size;
      this->size = local_48.size;
      local_48.d = pDVar1;
      local_48.ptr = pQVar7;
      local_48.size = (qsizetype)puVar3;
      if (old != (QArrayDataPointer<QPointer<QObject>_> *)0x0) {
        local_48.d = old->d;
        local_48.ptr = old->ptr;
        old->d = pDVar1;
        old->ptr = pQVar7;
        local_48.size = old->size;
        old->size = (qsizetype)puVar3;
      }
      ~QArrayDataPointer(&local_48);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        return;
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }